

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Attack(Map *this,Character *from,Direction direction)

{
  EIF *pEVar1;
  World *pWVar2;
  NPC *this_00;
  Character *this_01;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  mapped_type *pmVar9;
  reference ppCVar10;
  reference ppNVar11;
  ENF_Data *pEVar12;
  mapped_type *pmVar13;
  int *piVar14;
  double extraout_XMM0_Qa;
  double dVar15;
  bool local_411;
  byte local_38a;
  byte local_36b;
  byte local_36a;
  bool local_369;
  allocator<char> local_349;
  key_type local_348;
  int local_328;
  int local_324;
  int local_320;
  int limitamount;
  string local_318;
  double local_2f8;
  double hit_rate;
  string local_2e8;
  allocator<char> local_2c1;
  key_type local_2c0;
  allocator<char> local_299;
  key_type local_298;
  allocator<char> local_271;
  key_type local_270;
  allocator<char> local_249;
  key_type local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  undefined1 local_1d8 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  formula_vars;
  key_type local_198;
  byte local_173;
  byte local_172;
  allocator<char> local_171;
  key_type local_170;
  byte local_149;
  double dStack_148;
  bool critical;
  double rand;
  int amount;
  NPC *local_118;
  NPC *npc;
  iterator __end2;
  iterator __begin2;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range2;
  int i;
  int local_d0;
  uint local_cc;
  int range;
  int target_y;
  int target_x;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  PacketBuilder builder;
  allocator<char> local_59;
  key_type local_58;
  bool local_35;
  int local_34;
  bool is_instrument;
  EIF_Data *pEStack_30;
  int wep_graphic;
  EIF_Data *shielddata;
  EIF_Data *wepdata;
  Character *pCStack_18;
  Direction direction_local;
  Character *from_local;
  Map *this_local;
  
  pEVar1 = this->world->eif;
  wepdata._7_1_ = direction;
  pCStack_18 = from;
  from_local = (Character *)this;
  puVar8 = (uint *)std::array<int,_15UL>::operator[](&from->paperdoll,8);
  shielddata = EIF::Get(pEVar1,*puVar8);
  pEVar1 = this->world->eif;
  puVar8 = (uint *)std::array<int,_15UL>::operator[](&pCStack_18->paperdoll,7);
  pEStack_30 = EIF::Get(pEVar1,*puVar8);
  if (((shielddata->subtype != Ranged) || (pEStack_30->subtype == Arrows)) ||
     ((shielddata->id == 0x16d && (bVar3 = std::operator!=(&shielddata->name,"Gun"), !bVar3)))) {
    pCStack_18->direction = wepdata._7_1_;
    pCStack_18->attacks = pCStack_18->attacks + 1;
    Character::CancelSpell(pCStack_18);
    if (pCStack_18->arena != (Arena *)0x0) {
      Arena::Attack(pCStack_18->arena,pCStack_18,wepdata._7_1_);
    }
    local_34 = (shielddata->field_25).scrollmap;
    local_369 = false;
    if (local_34 != 0) {
      local_369 = World::IsInstrument(this->world,local_34);
    }
    local_35 = local_369;
    bVar3 = false;
    builder.add_size._3_1_ = 0;
    local_36a = 0;
    if (local_369 == false) {
      local_36b = 1;
      if ((this->pk & 1U) == 0) {
        pWVar2 = this->world;
        std::allocator<char>::allocator();
        bVar3 = true;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"GlobalPK",&local_59)
        ;
        builder.add_size._3_1_ = 1;
        pmVar9 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar2->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_58);
        bVar4 = util::variant::operator_cast_to_bool(pmVar9);
        local_38a = 0;
        if (bVar4) {
          bVar4 = World::PKExcept(this->world,(int)this->id);
          local_38a = bVar4 ^ 0xff;
        }
        local_36b = local_38a;
      }
      local_36a = local_36b;
    }
    if ((builder.add_size._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_58);
    }
    if (bVar3) {
      std::allocator<char>::~allocator(&local_59);
    }
    if (((local_36a & 1) == 0) || (bVar3 = AttackPK(this,pCStack_18,wepdata._7_1_), !bVar3)) {
      PacketBuilder::PacketBuilder((PacketBuilder *)&__range1,PACKET_ATTACK,PACKET_PLAYER,3);
      iVar6 = Character::PlayerID(pCStack_18);
      PacketBuilder::AddShort((PacketBuilder *)&__range1,iVar6);
      PacketBuilder::AddChar((PacketBuilder *)&__range1,(uint)wepdata._7_1_);
      __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                         (&this->characters);
      character = (Character *)
                  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                            (&this->characters);
      while (bVar3 = std::operator!=(&__end1,(_Self *)&character), bVar3) {
        ppCVar10 = std::_List_iterator<Character_*>::operator*(&__end1);
        _target_x = *ppCVar10;
        if ((_target_x != pCStack_18) && (bVar3 = Character::InRange(pCStack_18,_target_x), bVar3))
        {
          Character::Send(_target_x,(PacketBuilder *)&__range1);
        }
        std::_List_iterator<Character_*>::operator++(&__end1);
      }
      if ((local_35 & 1U) == 0) {
        bVar3 = Character::CanInteractCombat(pCStack_18);
        if (bVar3) {
          range = (int)pCStack_18->x;
          local_cc = (uint)pCStack_18->y;
          local_d0 = 1;
          if (shielddata->subtype == Ranged) {
            pWVar2 = this->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i,"RangedDistance",(allocator<char> *)((long)&__range2 + 7));
            pmVar9 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     ::operator[](&(pWVar2->config).
                                   super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  ,(key_type *)&i);
            local_d0 = util::variant::operator_cast_to_int(pmVar9);
            std::__cxx11::string::~string((string *)&i);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
          }
          for (__range2._0_4_ = 0; (int)__range2 < local_d0; __range2._0_4_ = (int)__range2 + 1) {
            switch(pCStack_18->direction) {
            case DIRECTION_DOWN:
              local_cc = local_cc + 1;
              break;
            case DIRECTION_LEFT:
              range = range + -1;
              break;
            case DIRECTION_UP:
              local_cc = local_cc - 1;
              break;
            case DIRECTION_RIGHT:
              range = range + 1;
            }
            __end2 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&this->npcs);
            npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->npcs);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                               *)&npc), bVar3) {
              ppNVar11 = __gnu_cxx::
                         __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                         operator*(&__end2);
              local_118 = *ppNVar11;
              rand._6_1_ = 0;
              rand._5_1_ = 0;
              pEVar12 = NPC::ENF(local_118);
              if ((pEVar12->type == Passive) ||
                 (pEVar12 = NPC::ENF(local_118), pEVar12->type == Aggressive)) {
LAB_001db1fd:
                bVar3 = false;
                if (((local_118->alive & 1U) != 0) && (bVar3 = false, (uint)local_118->x == range))
                {
                  bVar3 = local_118->y == local_cc;
                }
              }
              else {
                uVar7 = (*(pCStack_18->super_Command_Source)._vptr_Command_Source[1])();
                pWVar2 = this->world;
                std::allocator<char>::allocator();
                rand._6_1_ = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&amount,"killnpc",(allocator<char> *)((long)&rand + 7));
                rand._5_1_ = 1;
                pmVar9 = std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ::operator[](&(pWVar2->admin_config).
                                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      ,(key_type *)&amount);
                iVar6 = util::variant::operator_cast_to_int(pmVar9);
                bVar3 = false;
                if (iVar6 <= (int)(uVar7 & 0xff)) goto LAB_001db1fd;
              }
              if ((rand._5_1_ & 1) != 0) {
                std::__cxx11::string::~string((string *)&amount);
              }
              if ((rand._6_1_ & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)((long)&rand + 7));
              }
              if (bVar3) {
                rand._0_4_ = util::rand();
                util::rand();
                iVar6 = (uint)local_118->direction - (uint)pCStack_18->direction;
                if (iVar6 < 1) {
                  iVar6 = -iVar6;
                }
                local_172 = 0;
                local_173 = 0;
                local_411 = true;
                dStack_148 = extraout_XMM0_Qa;
                if (iVar6 == 2) {
                  pWVar2 = this->world;
                  std::allocator<char>::allocator();
                  local_172 = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_170,"CriticalRate",&local_171);
                  local_173 = 1;
                  pmVar9 = std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ::operator[](&(pWVar2->config).
                                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        ,&local_170);
                  dVar15 = util::variant::operator_cast_to_double(pmVar9);
                  local_411 = extraout_XMM0_Qa < dVar15;
                }
                if ((local_173 & 1) != 0) {
                  std::__cxx11::string::~string((string *)&local_170);
                }
                if ((local_172 & 1) != 0) {
                  std::allocator<char>::~allocator(&local_171);
                }
                local_149 = local_411;
                pWVar2 = this->world;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_198,"CriticalFirstHit",
                           (allocator<char> *)((long)&formula_vars._M_h._M_single_bucket + 7));
                pmVar9 = std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ::operator[](&(pWVar2->config).
                                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      ,&local_198);
                bVar4 = util::variant::operator_cast_to_bool(pmVar9);
                bVar3 = false;
                if (bVar4) {
                  iVar6 = local_118->hp;
                  pEVar12 = NPC::ENF(local_118);
                  bVar3 = iVar6 == pEVar12->hp;
                }
                std::__cxx11::string::~string((string *)&local_198);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)&formula_vars._M_h._M_single_bucket + 7));
                if (bVar3) {
                  local_149 = 1;
                }
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)local_1d8);
                this_01 = pCStack_18;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1f8,"",&local_1f9);
                Character::FormulaVars
                          (this_01,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                    *)local_1d8,&local_1f8);
                std::__cxx11::string::~string((string *)&local_1f8);
                std::allocator<char>::~allocator(&local_1f9);
                this_00 = local_118;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_220,"target_",&local_221);
                NPC::FormulaVars(this_00,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                          *)local_1d8,&local_220);
                std::__cxx11::string::~string((string *)&local_220);
                std::allocator<char>::~allocator(&local_221);
                pWVar2 = this->world;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_248,"MobRate",&local_249);
                pmVar9 = std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ::operator[](&(pWVar2->config).
                                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      ,&local_248);
                dVar15 = util::variant::operator_cast_to_double(pmVar9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_270,"modifier",&local_271);
                pmVar13 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                        *)local_1d8,&local_270);
                *pmVar13 = dVar15;
                std::__cxx11::string::~string((string *)&local_270);
                std::allocator<char>::~allocator(&local_271);
                std::__cxx11::string::~string((string *)&local_248);
                std::allocator<char>::~allocator(&local_249);
                dVar15 = (double)rand._0_4_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_298,"damage",&local_299);
                pmVar13 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                        *)local_1d8,&local_298);
                *pmVar13 = dVar15;
                std::__cxx11::string::~string((string *)&local_298);
                std::allocator<char>::~allocator(&local_299);
                bVar5 = local_149 & 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2c0,"critical",&local_2c1);
                pmVar13 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                        *)local_1d8,&local_2c0);
                *pmVar13 = (double)bVar5;
                std::__cxx11::string::~string((string *)&local_2c0);
                std::allocator<char>::~allocator(&local_2c1);
                pWVar2 = this->world;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2e8,"damage",(allocator<char> *)((long)&hit_rate + 7));
                dVar15 = World::EvalFormula(pWVar2,&local_2e8,
                                            (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                             *)local_1d8);
                rand._0_4_ = (int)dVar15;
                std::__cxx11::string::~string((string *)&local_2e8);
                std::allocator<char>::~allocator((allocator<char> *)((long)&hit_rate + 7));
                pWVar2 = this->world;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_318,"hit_rate",
                           (allocator<char> *)((long)&limitamount + 3));
                dVar15 = World::EvalFormula(pWVar2,&local_318,
                                            (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                             *)local_1d8);
                std::__cxx11::string::~string((string *)&local_318);
                std::allocator<char>::~allocator((allocator<char> *)((long)&limitamount + 3));
                if (dVar15 < dStack_148) {
                  rand._0_4_ = 0;
                }
                local_320 = 0;
                local_2f8 = dVar15;
                piVar14 = std::max<int>((int *)&rand,&local_320);
                rand._0_4_ = *piVar14;
                local_328 = local_118->hp;
                piVar14 = std::min<int>((int *)&rand,&local_328);
                local_324 = *piVar14;
                pWVar2 = this->world;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_348,"LimitDamage",&local_349);
                pmVar9 = std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ::operator[](&(pWVar2->config).
                                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      ,&local_348);
                bVar3 = util::variant::operator_cast_to_bool(pmVar9);
                std::__cxx11::string::~string((string *)&local_348);
                std::allocator<char>::~allocator(&local_349);
                if (bVar3) {
                  rand._0_4_ = local_324;
                }
                NPC::Damage(local_118,pCStack_18,rand._0_4_,-1);
                target_y = 1;
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                  *)local_1d8);
                goto LAB_001dbe00;
              }
              __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
              operator++(&__end2);
            }
            bVar3 = Walkable(this,(uchar)range,(uchar)local_cc,true);
            if (!bVar3) {
              target_y = 1;
              goto LAB_001dbe00;
            }
          }
          target_y = 0;
        }
        else {
          target_y = 1;
        }
      }
      else {
        target_y = 1;
      }
LAB_001dbe00:
      PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
    }
  }
  return;
}

Assistant:

void Map::Attack(Character *from, Direction direction)
{
	const EIF_Data& wepdata = this->world->eif->Get(from->paperdoll[Character::Weapon]);
	const EIF_Data& shielddata = this->world->eif->Get(from->paperdoll[Character::Shield]);

	if (wepdata.subtype == EIF::Ranged && shielddata.subtype != EIF::Arrows)
	{
		// Ranged gun hack
		if (wepdata.id != 365 || wepdata.name != "Gun")
		{
			return;
		}
		// / Ranged gun hack
	}

	from->direction = direction;
	from->attacks += 1;

	from->CancelSpell();

	if (from->arena)
	{
		from->arena->Attack(from, direction);
	}

	int wep_graphic = wepdata.dollgraphic;
	bool is_instrument = (wep_graphic != 0 && this->world->IsInstrument(wep_graphic));

	if (!is_instrument && (this->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id))))
	{
		if (this->AttackPK(from, direction))
		{
			return;
		}
	}

	PacketBuilder builder(PACKET_ATTACK, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}

	if (is_instrument)
		return;

	if (!from->CanInteractCombat())
		return;

	int target_x = from->x;
	int target_y = from->y;

	int range = 1;

	if (wepdata.subtype == EIF::Ranged)
	{
		range = static_cast<int>(this->world->config["RangedDistance"]);
	}

	for (int i = 0; i < range; ++i)
	{
		switch (from->direction)
		{
			case DIRECTION_UP:
				target_y -= 1;
				break;

			case DIRECTION_RIGHT:
				target_x += 1;
				break;

			case DIRECTION_DOWN:
				target_y += 1;
				break;

			case DIRECTION_LEFT:
				target_x -= 1;
				break;
		}

		UTIL_FOREACH(this->npcs, npc)
		{
			if ((npc->ENF().type == ENF::Passive || npc->ENF().type == ENF::Aggressive || from->SourceDutyAccess() >= static_cast<int>(this->world->admin_config["killnpc"]))
			 && npc->alive && npc->x == target_x && npc->y == target_y)
			{
				int amount = util::rand(from->mindam, from->maxdam);
				double rand = util::rand(0.0, 1.0);
				// Checks if target is facing you
				bool critical = std::abs(int(npc->direction) - from->direction) != 2 || rand < static_cast<double>(this->world->config["CriticalRate"]);

				if (this->world->config["CriticalFirstHit"] && npc->hp == npc->ENF().hp)
					critical = true;

				std::unordered_map<std::string, double> formula_vars;

				from->FormulaVars(formula_vars);
				npc->FormulaVars(formula_vars, "target_");
				formula_vars["modifier"] = this->world->config["MobRate"];
				formula_vars["damage"] = amount;
				formula_vars["critical"] = critical;

				amount = this->world->EvalFormula("damage", formula_vars);
				double hit_rate = this->world->EvalFormula("hit_rate", formula_vars);

				if (rand > hit_rate)
				{
					amount = 0;
				}

				amount = std::max(amount, 0);

				int limitamount = std::min(amount, int(npc->hp));

				if (this->world->config["LimitDamage"])
				{
					amount = limitamount;
				}

				npc->Damage(from, amount);
				// *npc may not be valid here

				return;
			}
		}

		if (!this->Walkable(target_x, target_y, true))
		{
			return;
		}
	}
}